

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_context.c
# Opt level: O0

int pcre2_set_glob_separator_16(pcre2_convert_context_16 *ccontext,uint32_t separator)

{
  uint32_t separator_local;
  pcre2_convert_context_16 *ccontext_local;
  
  if (((separator == 0x2f) || (separator == 0x5c)) || (separator == 0x2e)) {
    ccontext->glob_separator = separator;
    ccontext_local._4_4_ = 0;
  }
  else {
    ccontext_local._4_4_ = -0x1d;
  }
  return ccontext_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_set_glob_separator(pcre2_convert_context *ccontext, uint32_t separator)
{
if (separator != CHAR_SLASH && separator != CHAR_BACKSLASH &&
    separator != CHAR_DOT) return PCRE2_ERROR_BADDATA;
ccontext->glob_separator = separator;
return 0;
}